

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O2

void __thiscall httpparser::Response::~Response(Response *this)

{
  std::__cxx11::string::~string((string *)&this->status);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->content).super__Vector_base<char,_std::allocator<char>_>);
  std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>::
  ~vector(&this->headers);
  return;
}

Assistant:

Response()
        : versionMajor(0), versionMinor(0), keepAlive(false), statusCode(0)
    {}